

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

cmSourceFile * __thiscall
cmLocalGenerator::LinearGetSourceFileWithOutput
          (cmLocalGenerator *this,string *name,cmSourceOutputKind kind,bool *byproduct)

{
  pointer puVar1;
  bool bVar2;
  cmCustomCommand *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  pointer puVar5;
  cmSourceFile *pcVar6;
  
  *byproduct = false;
  puVar5 = (this->Makefile->SourceFiles).
           super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Makefile->SourceFiles).
           super__Vector_base<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar6 = (cmSourceFile *)0x0;
  do {
    if (puVar5 == puVar1) {
      *byproduct = pcVar6 != (cmSourceFile *)0x0;
      return pcVar6;
    }
    pcVar3 = cmSourceFile::GetCustomCommand
                       ((puVar5->_M_t).
                        super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t
                        .super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                        super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
    if (pcVar3 != (cmCustomCommand *)0x0) {
      pcVar3 = cmSourceFile::GetCustomCommand
                         ((puVar5->_M_t).
                          super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                          .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
      pvVar4 = cmCustomCommand::GetOutputs_abi_cxx11_(pcVar3);
      bVar2 = anon_unknown.dwarf_aba140::AnyOutputMatches(name,pvVar4);
      if (bVar2) {
        return (puVar5->_M_t).
               super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
               super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
               super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
      }
      if (kind == OutputOrByproduct) {
        pcVar3 = cmSourceFile::GetCustomCommand
                           ((puVar5->_M_t).
                            super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>
                            .super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl);
        pvVar4 = cmCustomCommand::GetByproducts_abi_cxx11_(pcVar3);
        bVar2 = anon_unknown.dwarf_aba140::AnyOutputMatches(name,pvVar4);
        if (bVar2) {
          pcVar6 = (puVar5->_M_t).
                   super___uniq_ptr_impl<cmSourceFile,_std::default_delete<cmSourceFile>_>._M_t.
                   super__Tuple_impl<0UL,_cmSourceFile_*,_std::default_delete<cmSourceFile>_>.
                   super__Head_base<0UL,_cmSourceFile_*,_false>._M_head_impl;
        }
      }
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

cmSourceFile* cmLocalGenerator::LinearGetSourceFileWithOutput(
  const std::string& name, cmSourceOutputKind kind, bool& byproduct) const
{
  // Outputs take precedence over byproducts.
  byproduct = false;
  cmSourceFile* fallback = nullptr;

  // Look through all the source files that have custom commands and see if the
  // custom command has the passed source file as an output.
  for (const auto& src : this->Makefile->GetSourceFiles()) {
    // Does this source file have a custom command?
    if (src->GetCustomCommand()) {
      // Does the output of the custom command match the source file name?
      if (AnyOutputMatches(name, src->GetCustomCommand()->GetOutputs())) {
        // Return the first matching output.
        return src.get();
      }
      if (kind == cmSourceOutputKind::OutputOrByproduct) {
        if (AnyOutputMatches(name, src->GetCustomCommand()->GetByproducts())) {
          // Do not return the source yet as there might be a matching output.
          fallback = src.get();
        }
      }
    }
  }

  // Did we find a byproduct?
  byproduct = fallback != nullptr;
  return fallback;
}